

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

wchar_t archive_mstring_copy_mbs_len(archive_mstring *aes,char *mbs,size_t len)

{
  long in_RSI;
  size_t in_RDI;
  archive_string *unaff_retaddr;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (in_RSI == 0) {
    *(undefined4 *)(in_RDI + 0x60) = 0;
  }
  else {
    *(undefined4 *)(in_RDI + 0x60) = 1;
    *(undefined8 *)(in_RDI + 8) = 0;
    archive_strncat(unaff_retaddr,
                    (void *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI);
    *(undefined8 *)(in_RDI + 0x20) = 0;
    *(undefined8 *)(in_RDI + 0x38) = 0;
  }
  return L'\0';
}

Assistant:

int
archive_mstring_copy_mbs_len(struct archive_mstring *aes, const char *mbs,
    size_t len)
{
	if (mbs == NULL) {
		aes->aes_set = 0;
		return (0);
	}
	aes->aes_set = AES_SET_MBS; /* Only MBS form is set now. */
	archive_strncpy(&(aes->aes_mbs), mbs, len);
	archive_string_empty(&(aes->aes_utf8));
	archive_wstring_empty(&(aes->aes_wcs));
	return (0);
}